

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void * xmlListSearch(xmlListPtr l,void *data)

{
  xmlLinkPtr pxVar1;
  xmlLinkPtr lk;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local = (xmlListPtr)0x0;
  }
  else {
    pxVar1 = xmlListLinkSearch(l,data);
    if (pxVar1 == (xmlLinkPtr)0x0) {
      l_local = (xmlListPtr)0x0;
    }
    else {
      l_local = (xmlListPtr)pxVar1->data;
    }
  }
  return l_local;
}

Assistant:

void *
xmlListSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListLinkSearch(l, data);
    if (lk)
        return (lk->data);
    return NULL;
}